

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btPlane>::resize
          (btAlignedObjectArray<btPlane> *this,int newsize,btPlane *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  btPlane *pbVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = this->m_size;
  lVar6 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar5 = lVar6 * 0x14;
    for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
      pbVar3 = this->m_data;
      *(btScalar *)((long)(&pbVar3->normal + 1) + lVar5) = fillData->dist;
      uVar4 = *(undefined8 *)((fillData->normal).m_floats + 2);
      puVar1 = (undefined8 *)((long)(pbVar3->normal).m_floats + lVar5);
      *puVar1 = *(undefined8 *)(fillData->normal).m_floats;
      puVar1[1] = uVar4;
      lVar5 = lVar5 + 0x14;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}